

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_extensions.cpp
# Opt level: O0

uint __thiscall ONX_ErrorCounter::AddLibraryWarnings(ONX_ErrorCounter *this)

{
  uint uVar1;
  uint local_2c;
  uint count;
  uint count0;
  bool bActive;
  ONX_ErrorCounter *this_local;
  
  uVar1 = this->m_state_bit_field;
  local_2c = this->m_opennurbs_library_warning_count;
  ClearLibraryWarnings(this);
  if ((uVar1 & 2) == 0) {
    local_2c = 0;
  }
  else {
    local_2c = this->m_opennurbs_library_warning_count - local_2c;
    if (local_2c != 0) {
      this->m_warning_count = local_2c + this->m_warning_count;
    }
  }
  return local_2c;
}

Assistant:

unsigned int ONX_ErrorCounter::AddLibraryWarnings()
{
  const bool bActive = (0 != (2 & m_state_bit_field));
  const unsigned int count0 = m_opennurbs_library_warning_count;
  ClearLibraryWarnings();
  const unsigned int count
    = bActive
    ? (m_opennurbs_library_warning_count - count0)
    : 0U;
  if (bActive && count>0)
    m_warning_count += count; // <- Good location for a debugger breakpoint.
  return count;
}